

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceClass
          (Generator *this,ServiceDescriptor *descriptor)

{
  ServiceDescriptor *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  Printer *in_stack_00000030;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  ServiceDescriptor *in_stack_00000048;
  Generator *in_stack_00000050;
  
  ServiceDescriptor::name_abi_cxx11_(in_RSI);
  io::Printer::Print<char[11],std::__cxx11::string>
            (in_stack_00000040,in_stack_00000038,&in_stack_00000030->variable_delimiter_,
             in_stack_00000028);
  io::Printer::Indent((Printer *)0x4c11a4);
  PrintDescriptorKeyAndModuleName(in_stack_00000050,in_stack_00000048);
  io::Printer::Print<>(in_stack_00000030,(char *)in_stack_00000028);
  io::Printer::Outdent(in_stack_00000040);
  return;
}

Assistant:

void Generator::PrintServiceClass(const ServiceDescriptor& descriptor) const {
  // Print the service.
  printer_->Print(
      "$class_name$ = service_reflection.GeneratedServiceType("
      "'$class_name$', (_service.Service,), dict(\n",
      "class_name", descriptor.name());
  printer_->Indent();
  Generator::PrintDescriptorKeyAndModuleName(descriptor);
  printer_->Print("))\n\n");
  printer_->Outdent();
}